

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_ehlo_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  SessionHandle *data_00;
  int iVar1;
  size_t sVar2;
  char *__s1;
  ulong uVar3;
  bool bVar4;
  ulong local_48;
  size_t wordlen;
  size_t len;
  char *line;
  smtp_conn *smtpc;
  SessionHandle *data;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  sVar2 = strlen((data_00->state).buffer);
  if ((smtpcode / 100 == 2) || (smtpcode == 1)) {
    __s1 = (data_00->state).buffer + 4;
    uVar3 = sVar2 - 4;
    if ((uVar3 < 8) || (*(long *)__s1 != 0x534c545452415453)) {
      if ((uVar3 < 4) || (*(int *)__s1 != 0x455a4953)) {
        if ((4 < uVar3) && (iVar1 = memcmp(__s1,"AUTH ",5), iVar1 == 0)) {
          (conn->proto).imapc.resptag[2] = '\x01';
          len = (size_t)((data_00->state).buffer + 9);
          wordlen = sVar2 - 9;
          while( true ) {
            while( true ) {
              bVar4 = false;
              if ((((wordlen != 0) && (bVar4 = true, *(char *)len != ' ')) &&
                  (bVar4 = true, *(char *)len != '\t')) && (bVar4 = true, *(char *)len != '\r')) {
                bVar4 = *(char *)len == '\n';
              }
              if (!bVar4) break;
              len = len + 1;
              wordlen = wordlen - 1;
            }
            if (wordlen == 0) break;
            local_48 = 0;
            while( true ) {
              bVar4 = false;
              if (((local_48 < wordlen) && (bVar4 = false, *(char *)(len + local_48) != ' ')) &&
                 ((bVar4 = false, *(char *)(len + local_48) != '\t' &&
                  (bVar4 = false, *(char *)(len + local_48) != '\r')))) {
                bVar4 = *(char *)(len + local_48) != '\n';
              }
              if (!bVar4) break;
              local_48 = local_48 + 1;
            }
            if ((local_48 == 5) && (iVar1 = memcmp((void *)len,"LOGIN",5), iVar1 == 0)) {
              (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 1;
            }
            else if ((local_48 == 5) && (iVar1 = memcmp((void *)len,"PLAIN",5), iVar1 == 0)) {
              (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 2;
            }
            else if ((local_48 == 8) && (iVar1 = memcmp((void *)len,"CRAM-MD5",8), iVar1 == 0)) {
              (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 4;
            }
            else if ((local_48 == 10) && (iVar1 = memcmp((void *)len,"DIGEST-MD5",10), iVar1 == 0))
            {
              (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 8;
            }
            else if ((local_48 == 6) && (iVar1 = memcmp((void *)len,"GSSAPI",6), iVar1 == 0)) {
              (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 0x10;
            }
            else if ((local_48 == 8) && (iVar1 = memcmp((void *)len,"EXTERNAL",8), iVar1 == 0)) {
              (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 0x20;
            }
            else if ((local_48 == 4) && (iVar1 = memcmp((void *)len,"NTLM",4), iVar1 == 0)) {
              (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 0x40;
            }
            else if ((local_48 == 7) && (iVar1 = memcmp((void *)len,"XOAUTH2",7), iVar1 == 0)) {
              (conn->proto).imapc.prefmech = (conn->proto).imapc.prefmech | 0x80;
            }
            len = local_48 + len;
            wordlen = wordlen - local_48;
          }
        }
      }
      else {
        (conn->proto).imapc.resptag[1] = '\x01';
      }
    }
    else {
      (conn->proto).imapc.resptag[0] = '\x01';
    }
    if (smtpcode != 1) {
      if (((data_00->set).use_ssl == CURLUSESSL_NONE) || ((conn->ssl[0].use & 1U) != 0)) {
        data._4_4_ = smtp_perform_authentication(conn);
      }
      else if (((conn->proto).imapc.resptag[0] & 1U) == 0) {
        if ((data_00->set).use_ssl == CURLUSESSL_TRY) {
          data._4_4_ = smtp_perform_authentication(conn);
        }
        else {
          Curl_failf(data_00,"STARTTLS not supported.");
          data._4_4_ = CURLE_USE_SSL_FAILED;
        }
      }
      else {
        data._4_4_ = smtp_perform_starttls(conn);
      }
    }
  }
  else if (((data_00->set).use_ssl < CURLUSESSL_CONTROL) || ((conn->ssl[0].use & 1U) != 0)) {
    data._4_4_ = smtp_perform_helo(conn);
  }
  else {
    Curl_failf(data_00,"Remote access denied: %d",(ulong)(uint)smtpcode);
    data._4_4_ = CURLE_REMOTE_ACCESS_DENIED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_ehlo_resp(struct connectdata *conn, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  const char *line = data->state.buffer;
  size_t len = strlen(line);
  size_t wordlen;

  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2 && smtpcode != 1) {
    if(data->set.use_ssl <= CURLUSESSL_TRY || conn->ssl[FIRSTSOCKET].use)
      result = smtp_perform_helo(conn);
    else {
      failf(data, "Remote access denied: %d", smtpcode);
      result = CURLE_REMOTE_ACCESS_DENIED;
    }
  }
  else {
    line += 4;
    len -= 4;

    /* Does the server support the STARTTLS capability? */
    if(len >= 8 && !memcmp(line, "STARTTLS", 8))
      smtpc->tls_supported = TRUE;

    /* Does the server support the SIZE capability? */
    else if(len >= 4 && !memcmp(line, "SIZE", 4))
      smtpc->size_supported = TRUE;

    /* Does the server support authentication? */
    else if(len >= 5 && !memcmp(line, "AUTH ", 5)) {
      smtpc->auth_supported = TRUE;

      /* Advance past the AUTH keyword */
      line += 5;
      len -= 5;

      /* Loop through the data line */
      for(;;) {
        while(len &&
              (*line == ' ' || *line == '\t' ||
               *line == '\r' || *line == '\n')) {

          line++;
          len--;
        }

        if(!len)
          break;

        /* Extract the word */
        for(wordlen = 0; wordlen < len && line[wordlen] != ' ' &&
              line[wordlen] != '\t' && line[wordlen] != '\r' &&
              line[wordlen] != '\n';)
          wordlen++;

        /* Test the word for a matching authentication mechanism */
        if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_LOGIN))
          smtpc->authmechs |= SASL_MECH_LOGIN;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_PLAIN))
          smtpc->authmechs |= SASL_MECH_PLAIN;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_CRAM_MD5))
          smtpc->authmechs |= SASL_MECH_CRAM_MD5;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_DIGEST_MD5))
          smtpc->authmechs |= SASL_MECH_DIGEST_MD5;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_GSSAPI))
          smtpc->authmechs |= SASL_MECH_GSSAPI;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_EXTERNAL))
          smtpc->authmechs |= SASL_MECH_EXTERNAL;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_NTLM))
          smtpc->authmechs |= SASL_MECH_NTLM;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_XOAUTH2))
          smtpc->authmechs |= SASL_MECH_XOAUTH2;

        line += wordlen;
        len -= wordlen;
      }
    }

    if(smtpcode != 1) {
      if(data->set.use_ssl && !conn->ssl[FIRSTSOCKET].use) {
        /* We don't have a SSL/TLS connection yet, but SSL is requested */
        if(smtpc->tls_supported)
          /* Switch to TLS connection now */
          result = smtp_perform_starttls(conn);
        else if(data->set.use_ssl == CURLUSESSL_TRY)
          /* Fallback and carry on with authentication */
          result = smtp_perform_authentication(conn);
        else {
          failf(data, "STARTTLS not supported.");
          result = CURLE_USE_SSL_FAILED;
        }
      }
      else
        result = smtp_perform_authentication(conn);
    }
  }

  return result;
}